

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

fft_plan * sptk::world::fft_plan_dft_c2r_1d(int n,fft_complex *in,double *out,uint flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  int *piVar6;
  double *in_RCX;
  fft_complex *in_RDX;
  int in_ESI;
  fft_plan *in_RDI;
  uint in_R8D;
  double *unaff_retaddr;
  fft_plan *output;
  int in_stack_00000014;
  fft_plan *ip;
  
  ip = in_RDI;
  memset(in_RDI,0,0x48);
  in_RDI->n = in_ESI;
  in_RDI->in = (double *)0x0;
  in_RDI->c_in = in_RDX;
  in_RDI->out = in_RCX;
  in_RDI->c_out = (fft_complex *)0x0;
  in_RDI->sign = 2;
  in_RDI->flags = in_R8D;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  in_RDI->input = pdVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ESI;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  in_RDI->ip = piVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)((in_ESI * 5) / 4);
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  in_RDI->w = pdVar5;
  *in_RDI->ip = 0;
  makewt(in_stack_00000014,&output->n,unaff_retaddr);
  makect(in_R8D,&ip->n,(double *)in_RDI);
  return ip;
}

Assistant:

fft_plan fft_plan_dft_c2r_1d(int n, fft_complex *in, double *out,
    unsigned int flags) {
#if 0
  void makewt(int nw, int *ip, double *w);
  void makect(int nc, int *ip, double *c);
#endif

  fft_plan output = {0};
  output.n = n;
  output.in = NULL;
  output.c_in = in;
  output.out = out;
  output.c_out = NULL;
  output.sign = FFT_BACKWARD;
  output.flags = flags;
  output.input = new double[n];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 2, output.ip, output.w);
  makect(output.n >> 2, output.ip, output.w + (output.n >> 2));
  return output;
}